

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeHFE.cpp
# Opt level: O1

int __thiscall
FormatTypeHFE::LoadDisk
          (FormatTypeHFE *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  IDisk *this_00;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  MFMTrack *pMVar8;
  void *pvVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  uchar *puVar15;
  ulong uVar16;
  int iVar17;
  size_t __n;
  uchar buf [512];
  undefined1 local_238 [256];
  undefined1 local_138 [264];
  
  iVar11 = -1;
  if (*(long *)buffer == 0x4546434950435848) {
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    bVar1 = buffer[9];
    bVar2 = buffer[10];
    this_00->nb_sides_ = bVar2;
    if (bVar2 != 0) {
      lVar14 = 0;
      do {
        *(uint *)((long)&this_00->side_[0].nb_tracks + lVar14) = (uint)bVar1;
        pvVar5 = operator_new__((ulong)bVar1 << 5);
        *(void **)((long)&this_00->side_[0].tracks + lVar14) = pvVar5;
        memset(pvVar5,0,(ulong)bVar1 << 5);
        lVar14 = lVar14 + 0x10;
      } while ((ulong)bVar2 * 0x10 != lVar14);
    }
    pvVar5 = operator_new__((ulong)((uint)bVar1 * 4));
    memcpy(pvVar5,buffer + 0x200,(ulong)((uint)bVar1 * 4));
    if ((ulong)bVar1 != 0) {
      uVar12 = 0;
      do {
        uVar3 = *(ushort *)((long)pvVar5 + uVar12 * 4);
        uVar4 = *(ushort *)((long)pvVar5 + uVar12 * 4 + 2);
        uVar16 = (ulong)(uVar4 >> 1);
        pvVar6 = operator_new__(uVar16);
        pvVar7 = operator_new__(uVar16);
        if (1 < uVar4) {
          puVar15 = buffer + (ulong)uVar3 * 0x200;
          iVar11 = 0;
          do {
            memcpy(local_238,puVar15,0x200);
            iVar13 = (int)uVar16;
            __n = 0x100;
            if (iVar13 < 0x100) {
              __n = uVar16;
            }
            memcpy((void *)((long)pvVar6 + (long)iVar11),local_238,__n);
            memcpy((void *)((long)pvVar7 + (long)iVar11),local_138,__n);
            iVar17 = (int)__n;
            iVar11 = iVar11 + iVar17;
            puVar15 = puVar15 + 0x200;
            uVar16 = (ulong)(uint)(iVar13 - iVar17);
          } while (iVar13 - iVar17 != 0 && iVar17 <= iVar13);
        }
        if (this_00->nb_sides_ != '\0') {
          uVar16 = 0;
          do {
            uVar10 = (ulong)*(ushort *)((long)pvVar5 + uVar12 * 4 + 2) << 2;
            pMVar8 = this_00->side_[uVar16].tracks;
            pMVar8[uVar12].size = (uint)uVar10;
            puVar15 = (uchar *)operator_new__(uVar10);
            pMVar8[uVar12].bitfield = puVar15;
            pMVar8 = this_00->side_[uVar16].tracks;
            if (pMVar8[uVar12].size != 0) {
              pvVar9 = pvVar7;
              if (uVar16 == 0) {
                pvVar9 = pvVar6;
              }
              uVar10 = 0;
              do {
                pMVar8[uVar12].bitfield[uVar10] =
                     (*(byte *)((long)pvVar9 + (uVar10 >> 3 & 0x1fffffff)) >> ((uint)uVar10 & 7) & 1
                     ) != 0;
                uVar10 = uVar10 + 1;
                pMVar8 = this_00->side_[uVar16].tracks;
              } while (uVar10 < pMVar8[uVar12].size);
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 < this_00->nb_sides_);
        }
        operator_delete__(pvVar6);
        operator_delete__(pvVar7);
        uVar12 = uVar12 + 1;
      } while (uVar12 != bVar1);
    }
    operator_delete__(pvVar5);
    *created_disk = this_00;
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int FormatTypeHFE::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                            ILoadingProgress* loading_progress)
{
   if (memcmp(buffer, "HXCPICFE", 8) == 0)
   {
      IDisk* new_disk = new IDisk();

      // Header
      int index_buffer = 0;

      Picfileformatheader header;
      //fread(&header, 1, sizeof(header), file);
      memcpy(&header, buffer, sizeof(header));
      index_buffer += sizeof(header);

      // Number of sides
      new_disk->nb_sides_ = header.number_of_side;

      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         new_disk->side_[side].nb_tracks = header.number_of_track;
         new_disk->side_[side].tracks = new IDisk::MFMTrack[new_disk->side_[side].nb_tracks];
         memset(new_disk->side_[side].tracks, 0, sizeof(IDisk::MFMTrack) * new_disk->side_[side].nb_tracks);
      }

      //fseek(file, 0x200, SEEK_SET);
      index_buffer = 0x200;

      Pictrack* pck_trk = new Pictrack[header.number_of_track];
      //fread(pck_trk, 1, sizeof(pck_trk) * header.number_of_track, file);
      memcpy(pck_trk, &buffer[index_buffer], sizeof(Pictrack) * header.number_of_track);
      index_buffer += sizeof(pck_trk) * header.number_of_track;

      // Second part : (up to 1024 bytes) : Track offset LUT
      unsigned char* buffer1;
      unsigned char* buffer2;
      for (int track = 0; track < header.number_of_track; track++)
      {
         // Track data
         //fseek(file, 0x200 * pck_trk[track].offset, SEEK_SET);
         index_buffer = 0x200 * pck_trk[track].offset;

         // Read bytes
         buffer1 = new unsigned char[pck_trk[track].track_len / 2];
         buffer2 = new unsigned char[pck_trk[track].track_len / 2];

         int byte_to_read = pck_trk[track].track_len / 2;
         unsigned char buf[0x200];
         int index = 0;
         while (byte_to_read > 0)
         {
            //fread(buf, 1, 0x200, file);
            memcpy(buf, &buffer[index_buffer], 0x200);
            index_buffer += 0x200;

            unsigned int cnt = (byte_to_read < 0x100) ? byte_to_read : 0x100;

            memcpy(&buffer1[index], buf, cnt);
            memcpy(&buffer2[index], &buf[0x100], cnt);

            byte_to_read -= cnt;
            index += cnt;
         }


         for (int side = 0; side < new_disk->nb_sides_; side++)
         {
            new_disk->side_[side].tracks[track].size = pck_trk[track].track_len * 4;
            new_disk->side_[side].tracks[track].bitfield = new unsigned char[new_disk->side_[side].
               tracks[track].size];

            // TODO : Multiple side
            for (unsigned int i = 0; i < new_disk->side_[side].tracks[track].size; i++)
            {
               new_disk->side_[side].tracks[track].bitfield[i] = (((side == 0) ? buffer1 : buffer2)[
                  i >> 3]) >> ((i & 7)) & 1;
            }
         }
         delete[]buffer1;
         delete[]buffer2;
      }

      delete[]pck_trk;

      created_disk = new_disk;
      return OK;
   }
   else
   {
      return FILE_ERROR;
   }
}